

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_client_reset(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->req).field_0xd9 >> 7 & 1) == 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client_reset, clear readers");
    }
    cl_reset_reader(data);
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              && (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"client_reset, will rewind reader");
  }
  cl_reset_writer(data);
  (data->req).bytecount = 0;
  (data->req).headerline = 0;
  return;
}

Assistant:

void Curl_client_reset(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    /* already requested */
    CURL_TRC_READ(data, "client_reset, will rewind reader");
  }
  else {
    CURL_TRC_READ(data, "client_reset, clear readers");
    cl_reset_reader(data);
  }
  cl_reset_writer(data);

  data->req.bytecount = 0;
  data->req.headerline = 0;
}